

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::retrieveGLConstantValues
          (TessellationShaderTessellationMaxInOut *this)

{
  GLint *pGVar1;
  GLint *pGVar2;
  GLint *pGVar3;
  GLint *pGVar4;
  ostringstream *poVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  NotSupportedError *pNVar9;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar8;
  
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x868))(0x9122);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xac7);
  (**(code **)(lVar8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xaca);
  pGVar1 = &this->m_gl_max_tess_control_output_components_value;
  (**(code **)(lVar8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS,pGVar1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,
                  "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xacd);
  (**(code **)(lVar8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_PATCH_COMPONENTS,
             &this->m_gl_max_tess_patch_components_value);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad0);
  pGVar2 = &this->m_gl_max_tess_evaluation_input_components_value;
  (**(code **)(lVar8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,pGVar2);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad4);
  pGVar3 = &this->m_gl_max_tess_evaluation_output_components_value;
  (**(code **)(lVar8 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,pGVar3);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad9);
  pGVar4 = &this->m_gl_max_transform_feedback_interleaved_components_value;
  (**(code **)(lVar8 + 0x868))(0x8c8a,pGVar4);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,
                  "glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xade);
  if (this->m_gl_max_vertex_output_components_value <
      this->m_gl_max_tess_control_input_components_value) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar5 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:",0x2f);
    std::ostream::operator<<(poVar5,this->m_gl_max_vertex_output_components_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5," is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: ",0x38);
    std::ostream::operator<<(poVar5,this->m_gl_max_tess_control_input_components_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,
               ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT per-vertex components from Vertex Shader to Tessellation Control Shader."
               ,0x96);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_138);
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS","");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1b0);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (*pGVar1 == *pGVar2) {
    if (*pGVar3 <= *pGVar4) {
      return;
    }
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar5 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:",0x36);
    std::ostream::operator<<(poVar5,*pGVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,
               " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:",0x42);
    std::ostream::operator<<(poVar5,*pGVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,
               ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Evaluation Shader."
               ,0x8d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_138);
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS"
               ,"");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1b0);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar5 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5,"Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:",0x33);
  std::ostream::operator<<(poVar5,*pGVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5," is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:",0x3d)
  ;
  std::ostream::operator<<(poVar5,*pGVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5,
             ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Control Shader to Tessellation Evaluation Shader."
             ,0xa8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_138);
  pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,
             "GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS","");
  tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1b0);
  __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationMaxInOut::retrieveGLConstantValues(void)
{
	/* Retrieve ES entry-points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Query implementation constants */
	gl.getIntegerv(GL_MAX_VERTEX_OUTPUT_COMPONENTS, &m_gl_max_vertex_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS, &m_gl_max_tess_control_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS, &m_gl_max_tess_control_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_PATCH_COMPONENTS, &m_gl_max_tess_patch_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,
				   &m_gl_max_transform_feedback_interleaved_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!");

	/* Sanity checks */
	DE_ASSERT(m_gl_max_vertex_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_patch_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_output_components_value != 0);
	DE_ASSERT(m_gl_max_transform_feedback_interleaved_components_value != 0);

	/* Make sure it is possible to transfer all components through all the stages.
	 * If not, the test may fail, so we throw not supported. */
	if (m_gl_max_vertex_output_components_value < m_gl_max_tess_control_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:"
						   << m_gl_max_vertex_output_components_value
						   << " is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: "
						   << m_gl_max_tess_control_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT "
							  "per-vertex components from Vertex Shader to Tessellation Control Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_control_output_components_value != m_gl_max_tess_evaluation_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_control_output_components_value
						   << " is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Control Shader to Tessellation "
							  "Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != "
									 "GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_evaluation_output_components_value > m_gl_max_transform_feedback_interleaved_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_output_components_value
						   << " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:"
						   << m_gl_max_transform_feedback_interleaved_components_value
						   << ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > "
									 "GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS");
	}
}